

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid_Image.cxx
# Opt level: O0

void __thiscall Fluid_Image::~Fluid_Image(Fluid_Image *this)

{
  int local_14;
  int a;
  Fluid_Image *this_local;
  
  if (images != (Fluid_Image **)0x0) {
    for (local_14 = 0; images[local_14] != this; local_14 = local_14 + 1) {
    }
    numimages = numimages + -1;
    for (; local_14 < numimages; local_14 = local_14 + 1) {
      images[local_14] = images[local_14 + 1];
    }
  }
  if (this->img != (Fl_Shared_Image *)0x0) {
    Fl_Shared_Image::release(this->img);
  }
  free(this->name_);
  return;
}

Assistant:

Fluid_Image::~Fluid_Image() {
  int a;
  if (images) {
    for (a = 0;; a++) if (images[a] == this) break;
    numimages--;
    for (; a < numimages; a++) images[a] = images[a+1];
  }
  if (img) img->release();
  free((void*)name_);
}